

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

void rw::cameraSync(ObjectWithFrame *obj)

{
  void **dst;
  V3d *a;
  LLLink *pLVar1;
  Matrix *pMVar2;
  long lVar3;
  float fVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  V3d VVar15;
  V3d VVar16;
  float local_e8;
  float fStack_e4;
  float local_d8;
  float fStack_d4;
  Matrix local_c8;
  V3d local_88;
  V3d local_78;
  Matrix inv;
  
  pMVar2 = Frame::getLTM((Frame *)(obj->object).parent);
  Matrix::invertOrthonormal(&inv,pMVar2);
  inv.right.x = (float32)-(float)inv.right.x;
  inv.up.x = (float32)-(float)inv.up.x;
  inv.at.x = (float32)-(float)inv.at.x;
  inv.pos.x = (float32)-(float)inv.pos.x;
  pLVar1 = obj[1].inFrame.next;
  fVar4 = SUB84(pLVar1,0);
  fVar6 = (float)((ulong)pLVar1 >> 0x20);
  auVar5._4_4_ = fVar6 + fVar6;
  auVar5._0_4_ = fVar4 + fVar4;
  auVar5._8_8_ = 0;
  auVar5 = divps(_DAT_0012fd30,auVar5);
  local_c8.right.x = auVar5._0_4_;
  fVar6 = auVar5._4_4_;
  local_c8.right.y = 0.0;
  local_c8.right.z = 0.0;
  local_c8.flags = 0;
  local_c8.up.x = 0.0;
  local_c8.up.y = (float32)-fVar6;
  local_c8.up.z = 0.0;
  dst = &obj[2].object.parent;
  fVar4 = *(float *)&obj[1].inFrame.prev;
  if (*(int *)&obj[2].object.field_0x4 == 1) {
    local_c8.pos.z = 0.0;
    local_c8.pos.x = (float32)((float)local_c8.right.x * -fVar4);
    local_c8.pos.y = (float32)(fVar6 * *(float *)((long)&obj[1].inFrame.prev + 4));
    local_c8.at.y = (float32)(0.5 - (float)local_c8.pos.y);
    local_c8.at.x = (float32)(0.5 - (float)local_c8.pos.x);
    local_c8.at.z = 1.0;
    Matrix::optimize(&local_c8,(Tolerance *)0x0);
    Matrix::mult((Matrix *)dst,&inv,&local_c8);
    pMVar2 = Frame::getLTM((Frame *)(obj->object).parent);
    local_78 = scale(&pMVar2->up,*(float32 *)((long)&obj[1].inFrame.next + 4));
    VVar15 = scale(&pMVar2->right,*(float32 *)&obj[1].inFrame.next);
    fVar6 = (float)VVar15.z;
    a = &pMVar2->at;
    VVar16 = add(a,&local_78);
    local_e8 = (float)VVar15.x;
    fStack_e4 = (float)VVar15.y;
    fVar4 = (float)VVar16.x + local_e8;
    obj[7].object.type = SUB41(fVar4,0);
    obj[7].object.subType = (char)((uint)fVar4 >> 8);
    obj[7].object.flags = (char)((uint)fVar4 >> 0x10);
    obj[7].object.privateFlags = (char)((uint)fVar4 >> 0x18);
    *(float *)&obj[7].object.field_0x4 = (float)VVar16.y + fStack_e4;
    *(float *)&obj[7].object.parent = (float)VVar16.z + fVar6;
    VVar15 = add(a,&local_78);
    *(ulong *)((long)&obj[7].object.parent + 4) =
         CONCAT44((float)VVar15.y - fStack_e4,(float)VVar15.x - local_e8);
    *(float *)((long)&obj[7].inFrame.next + 4) = (float)VVar15.z - fVar6;
    VVar15 = sub(a,&local_78);
    obj[7].inFrame.prev = (LLLink *)CONCAT44((float)VVar15.y - fStack_e4,(float)VVar15.x - local_e8)
    ;
    *(float *)&obj[7].syncCB = (float)VVar15.z - fVar6;
    VVar15 = sub(a,&local_78);
    *(ulong *)((long)&obj[7].syncCB + 4) =
         CONCAT44((float)VVar15.y + fStack_e4,(float)VVar15.x + local_e8);
    *(float *)&obj[8].object.field_0x4 = (float)VVar15.z + fVar6;
    VVar15 = scale(&pMVar2->up,*(float32 *)((long)&obj[1].inFrame.prev + 4));
    VVar16 = scale(&pMVar2->right,*(float32 *)&obj[1].inFrame.prev);
    local_e8 = (float)VVar15.x;
    fStack_e4 = (float)VVar15.y;
    local_88.z = (float32)((float)VVar15.z - (float)VVar16.z);
    local_88.y = (float32)(fStack_e4 - (float)VVar16.y);
    local_88.x = (float32)(local_e8 - (float)VVar16.x);
    for (lVar3 = 0x118; lVar3 != 0x148; lVar3 = lVar3 + 0xc) {
      VVar15 = sub((V3d *)(&(obj->object).type + lVar3),&local_88);
      VVar16 = add(&pMVar2->pos,&local_88);
      fVar4 = *(float *)&obj[1].syncCB;
      local_d8 = (float)VVar15.x;
      fStack_d4 = (float)VVar15.y;
      *(ulong *)(&(obj->object).type + lVar3) =
           CONCAT44(fVar4 * fStack_d4 + (float)VVar16.y,fVar4 * local_d8 + (float)VVar16.x);
      *(float *)((long)&(obj->object).parent + lVar3) = (float)VVar15.z * fVar4 + (float)VVar16.z;
      fVar4 = *(float *)((long)&obj[1].syncCB + 4);
      *(ulong *)((long)&obj[1].object.parent + lVar3) =
           CONCAT44(fVar4 * fStack_d4 + (float)VVar16.y,fVar4 * local_d8 + (float)VVar16.x);
      *(float *)((long)&obj[1].inFrame.next + lVar3) = (float)VVar15.z * fVar4 + (float)VVar16.z;
    }
  }
  else {
    local_c8.at.x = (float32)((float)local_c8.right.x * fVar4);
    local_c8.at.y = (float32)(fVar6 * -*(float *)((long)&obj[1].inFrame.prev + 4));
    local_c8.at.z = 1.0;
    local_c8.pos.y = (float32)(0.5 - (float)local_c8.at.y);
    local_c8.pos.x = (float32)(0.5 - (float)local_c8.at.x);
    local_c8.pos.z = 0.0;
    Matrix::optimize(&local_c8,(Tolerance *)0x0);
    Matrix::mult((Matrix *)dst,&inv,&local_c8);
    pMVar2 = Frame::getLTM((Frame *)(obj->object).parent);
    fVar4 = *(float *)&obj[1].syncCB;
    fVar6 = *(float *)((long)&obj[1].syncCB + 4);
    pLVar1 = obj[1].inFrame.next;
    fVar7 = SUB84(pLVar1,0);
    fVar8 = (float)((ulong)pLVar1 >> 0x20);
    pLVar1 = obj[1].inFrame.prev;
    fVar10 = SUB84(pLVar1,0);
    fVar9 = -(1.0 - fVar4) * fVar10;
    fVar12 = (float)((ulong)pLVar1 >> 0x20);
    fVar11 = (1.0 - fVar4) * fVar12;
    fVar13 = fVar9 + fVar7;
    fVar14 = fVar11 + fVar8;
    obj[7].object.type = SUB41(fVar13,0);
    obj[7].object.subType = (char)((uint)fVar13 >> 8);
    obj[7].object.flags = (char)((uint)fVar13 >> 0x10);
    obj[7].object.privateFlags = (char)((uint)fVar13 >> 0x18);
    *(float *)&obj[7].object.field_0x4 = fVar14;
    *(float *)&obj[7].object.parent = fVar4;
    *(float *)&obj[7].inFrame.next = fVar14;
    *(float *)((long)&obj[7].inFrame.next + 4) = fVar4;
    fVar9 = fVar9 - fVar7;
    fVar11 = fVar11 - fVar8;
    *(float *)((long)&obj[7].object.parent + 4) = fVar9;
    obj[7].inFrame.prev = (LLLink *)CONCAT44(fVar11,fVar9);
    *(float *)&obj[7].syncCB = fVar4;
    *(float *)((long)&obj[7].syncCB + 4) = fVar13;
    *(float *)&obj[8].object = fVar11;
    *(float *)&obj[8].object.field_0x4 = fVar4;
    fVar10 = -(1.0 - fVar6) * fVar10;
    fVar12 = (1.0 - fVar6) * fVar12;
    fVar4 = fVar7 + fVar10;
    fVar9 = fVar8 + fVar12;
    obj[8].object.parent = (void *)CONCAT44(fVar9,fVar4);
    *(float *)&obj[8].inFrame.next = fVar6;
    *(float *)&obj[8].inFrame.prev = fVar9;
    *(float *)((long)&obj[8].inFrame.prev + 4) = fVar6;
    fVar10 = fVar10 - fVar7;
    fVar12 = fVar12 - fVar8;
    *(float *)((long)&obj[8].inFrame.next + 4) = fVar10;
    obj[8].syncCB = (Sync)CONCAT44(fVar12,fVar10);
    *(float *)&obj[9].object = fVar6;
    *(float *)&obj[9].object.field_0x4 = fVar4;
    *(float *)&obj[9].object.parent = fVar12;
    *(float *)((long)&obj[9].object.parent + 4) = fVar6;
    V3d::transformPoints((V3d *)(obj + 7),(V3d *)(obj + 7),8,pMVar2);
  }
  buildPlanes((Camera *)obj);
  BBox::calculate((BBox *)&obj[9].inFrame,(V3d *)(obj + 7),8);
  return;
}

Assistant:

static void
cameraSync(ObjectWithFrame *obj)
{
	/*
	 * RW projection matrix looks like this:
	 *       (cf. Camera View Matrix white paper)
	 * w = viewWindow width
	 * h = viewWindow height
	 * o = view offset
	 *
	 * perspective:
	 * 1/2w       0    ox/2w + 1/2   -ox/2w
	 *    0   -1/2h   -oy/2h + 1/2    oy/2h
	 *    0       0              1        0
	 *    0       0              1        0
	 *
	 * parallel:
	 * 1/2w       0    ox/2w   -ox/2w + 1/2
	 *    0   -1/2h   -oy/2h    oy/2h + 1/2
	 *    0       0        1              0
	 *    0       0        0              1
	 *
	 * The view matrix transforms from world to clip space, it is however
	 * not used for OpenGL or D3D since transformation to camera space
	 * and to clip space are handled by separate matrices there.
	 * On these platforms the two matrices are built in the platform's
	 * beginUpdate function.
	 * On the PS2 the z- and w-rows are the same and the 
	 * 1/2 translation/shear is removed again on the VU1 by
	 * subtracting the w-row/2 from the x- and y-rows.
	 *
	 * perspective:
	 * 1/2w       0    ox/2w   -ox/2w
	 *    0   -1/2h   -oy/2h    oy/2h
	 *    0       0        1        0
	 *    0       0        1        0
	 *
	 * parallel:
	 * 1/2w       0    ox/2w   -ox/2w
	 *    0   -1/2h   -oy/2h    oy/2h
	 *    0       0        1        0
	 *    0       0        0        1
	 *
	 * RW builds this matrix directly without using explicit
	 * inversion and matrix multiplication.
	 */

	Camera *cam = (Camera*)obj;
	Matrix inv, proj;
	Matrix::invertOrthonormal(&inv, cam->getFrame()->getLTM());

	inv.right.x = -inv.right.x;
	inv.up.x = -inv.up.x;
	inv.at.x = -inv.at.x;
	inv.pos.x = -inv.pos.x;

	float32 xscl = 1.0f/(2.0f*cam->viewWindow.x);
	float32 yscl = 1.0f/(2.0f*cam->viewWindow.y);

	proj.flags = 0;
	proj.right.x = xscl;
	proj.right.y = 0.0f;
	proj.right.z = 0.0f;

	proj.up.x = 0.0f;
	proj.up.y = -yscl;
	proj.up.z = 0.0f;

	if(cam->projection == Camera::PERSPECTIVE){
		proj.pos.x = -cam->viewOffset.x*xscl;
		proj.pos.y = cam->viewOffset.y*yscl;
		proj.pos.z = 0.0f;

		proj.at.x = -proj.pos.x + 0.5f;
		proj.at.y = -proj.pos.y + 0.5f;
		proj.at.z = 1.0f;
		proj.optimize();
		Matrix::mult(&cam->viewMatrix, &inv, &proj);
		buildClipPersp(cam);
	}else{
		proj.at.x = cam->viewOffset.x*xscl;
		proj.at.y = -cam->viewOffset.y*yscl;
		proj.at.z = 1.0f;

		proj.pos.x = -proj.at.x + 0.5f;
		proj.pos.y = -proj.at.y + 0.5f;
		proj.pos.z = 0.0f;
		proj.optimize();
		Matrix::mult(&cam->viewMatrix, &inv, &proj);
		buildClipParallel(cam);
	}
	cam->frustumBoundBox.calculate(cam->frustumCorners, 8);
}